

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O1

void __thiscall IfNeuron::~IfNeuron(IfNeuron *this)

{
  size_type *this_00;
  
  this_00 = &this[-1].ifneuronMembrane.super_StochasticVariable.super_StochasticProcess.
             stochDescription._M_string_length;
  ~IfNeuron((IfNeuron *)this_00);
  operator_delete(this_00,0x308);
  return;
}

Assistant:

void IfNeuron::prepareNextState()
{
	// create next value of differential equation
	ifneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = ifneuronMembrane.isNextStatePrepared();
	stochNextValue = ifneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (eventNextValue) {
			ifneuronMembrane.init();
			stochNextValue = ifneuronMembrane.getNextValue();
			eventNextValue = false;
		} else {
			if (stochNextValue>ifneuronTheta) {
				stochNextValue = ifneuronSpikeHeight;
				eventNextValue = true;
			}
		}
	}
}